

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

unsigned_long ReadVarInt<DataStream,(VarIntMode)0,unsigned_long>(DataStream *is)

{
  long lVar1;
  byte bVar2;
  unsigned_long uVar3;
  char *pcVar4;
  error_code *this;
  long in_FS_OFFSET;
  uchar chData;
  unsigned_long n;
  CheckVarIntMode<(VarIntMode)0,_unsigned_long> *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  io_errc iVar5;
  error_code *in_stack_ffffffffffffff68;
  DataStream *in_stack_ffffffffffffff70;
  error_code *peVar6;
  ulong local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckVarIntMode<(VarIntMode)0,_unsigned_long>::CheckVarIntMode(in_stack_ffffffffffffff58);
  local_40 = 0;
  do {
    bVar2 = ser_readdata8<DataStream>(in_stack_ffffffffffffff70);
    uVar3 = std::numeric_limits<unsigned_long>::max();
    iVar5 = (io_errc)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    if (uVar3 >> 7 < local_40) {
      pcVar4 = (char *)__cxa_allocate_exception(0x20);
      std::error_code::error_code<std::io_errc,void>(in_stack_ffffffffffffff68,iVar5);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar4,(error_code *)"ReadVarInt(): size too large");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pcVar4,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
LAB_00399938:
      __stack_chk_fail();
    }
    local_40 = local_40 << 7 | (long)(int)(bVar2 & 0x7f);
    if ((bVar2 & 0x80) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_40;
      }
      goto LAB_00399938;
    }
    uVar3 = std::numeric_limits<unsigned_long>::max();
    iVar5 = (io_errc)((ulong)in_stack_ffffffffffffff60 >> 0x20);
    if (local_40 == uVar3) {
      this = (error_code *)__cxa_allocate_exception(0x20);
      peVar6 = this;
      std::error_code::error_code<std::io_errc,void>(this,iVar5);
      std::ios_base::failure[abi:cxx11]::failure
                ((char *)peVar6,(error_code *)"ReadVarInt(): size too large");
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(this,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_00399938;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

I ReadVarInt(Stream& is)
{
    CheckVarIntMode<Mode, I>();
    I n = 0;
    while(true) {
        unsigned char chData = ser_readdata8(is);
        if (n > (std::numeric_limits<I>::max() >> 7)) {
           throw std::ios_base::failure("ReadVarInt(): size too large");
        }
        n = (n << 7) | (chData & 0x7F);
        if (chData & 0x80) {
            if (n == std::numeric_limits<I>::max()) {
                throw std::ios_base::failure("ReadVarInt(): size too large");
            }
            n++;
        } else {
            return n;
        }
    }
}